

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall
pbrt::StatsAccumulator::ReportIntDistribution
          (StatsAccumulator *this,char *name,int64_t sum,int64_t count,int64_t min,int64_t max)

{
  mapped_type *pmVar1;
  long *plVar2;
  long in_RCX;
  long in_RDX;
  Distribution<long> *distrib;
  allocator<char> *in_stack_ffffffffffffffa0;
  key_type *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::Distribution<long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::Distribution<long>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::Distribution<long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::Distribution<long>_>_>_>
                         *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  pmVar1->sum = local_18 + pmVar1->sum;
  pmVar1->count = local_20 + pmVar1->count;
  plVar2 = std::min<long>(&pmVar1->min,&local_28);
  pmVar1->min = *plVar2;
  plVar2 = std::max<long>(&pmVar1->max,&local_30);
  pmVar1->max = *plVar2;
  return;
}

Assistant:

void StatsAccumulator::ReportIntDistribution(const char *name, int64_t sum, int64_t count,
                                             int64_t min, int64_t max) {
    Stats::Distribution<int64_t> &distrib = stats->intDistributions[name];
    distrib.sum += sum;
    distrib.count += count;
    distrib.min = std::min(distrib.min, min);
    distrib.max = std::max(distrib.max, max);
}